

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  int iVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  __m128i *palVar23;
  __m128i *b;
  __m128i *palVar24;
  __m128i *palVar25;
  __m128i *b_00;
  __m128i *palVar26;
  __m128i *ptr;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int64_t *ptr_00;
  ulong uVar27;
  ulong uVar28;
  size_t len;
  long lVar29;
  ulong uVar30;
  int64_t *piVar31;
  longlong lVar32;
  char *pcVar33;
  undefined8 extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar34;
  __m128i *ptr_01;
  uint uVar37;
  __m128i *ptr_02;
  char *__format;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  __m128i *ptr_03;
  long lVar43;
  int iVar44;
  ulong uVar45;
  ulong size;
  long lVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar55 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  int64_t iVar62;
  longlong lVar63;
  __m128i_64_t B;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  longlong lVar71;
  undefined1 auVar70 [16];
  longlong lVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  longlong lVar79;
  undefined1 auVar78 [16];
  longlong lVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  longlong lVar84;
  longlong lVar87;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i_64_t B_3;
  longlong lVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  __m128i_64_t B_2;
  longlong lVar93;
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  __m128i_64_t B_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i alVar104;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i *local_288;
  __m128i *local_280;
  undefined1 local_278 [16];
  undefined1 local_258 [16];
  int iStack_240;
  int iStack_1e0;
  int iStack_1d0;
  long local_1c8;
  long lStack_1c0;
  undefined1 local_1b8 [16];
  undefined4 local_188;
  undefined4 uStack_184;
  ulong uStack_110;
  undefined8 uStack_c0;
  undefined8 uStack_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_78;
  long lStack_70;
  __m128i_64_t e;
  __m128i_64_t h;
  long lVar35;
  ulong uVar36;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar33 = "profile";
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar33 = "profile->profile64.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar33 = "profile->matrix";
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar33 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar33 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar33 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar33 = "open";
        }
        else {
          if (-1 < gap) {
            uVar37 = uVar5 - 1;
            size = (ulong)uVar5 + 1 >> 1;
            uVar10 = (ulong)uVar37 % size;
            pvVar8 = (profile->profile64).matches;
            pvVar9 = (profile->profile64).similar;
            uVar28 = (ulong)(uint)open;
            iVar42 = -open;
            iVar44 = ppVar7->min;
            uVar45 = 0x8000000000000000 - (long)iVar44;
            if (iVar44 != iVar42 && SBORROW4(iVar44,iVar42) == iVar44 + open < 0) {
              uVar45 = uVar28 | 0x8000000000000000;
            }
            iVar44 = ppVar7->max;
            ppVar22 = parasail_result_new_rowcol3((uint)((ulong)uVar5 + 1) & 0x7ffffffe,s2Len);
            if (ppVar22 != (parasail_result_t *)0x0) {
              ppVar22->flag = ppVar22->flag | 0x2850801;
              local_288 = parasail_memalign___m128i(0x10,size);
              palVar23 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              palVar24 = parasail_memalign___m128i(0x10,size);
              local_280 = parasail_memalign___m128i(0x10,size);
              palVar25 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              palVar26 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              alVar104[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar104[1]._0_1_ = b_02 == (__m128i *)0x0;
              auVar48._0_8_ = -(ulong)(local_288 == (__m128i *)0x0);
              auVar48._8_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
              auVar73._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar73._8_8_ = -(ulong)(palVar24 == (__m128i *)0x0);
              auVar48 = packssdw(auVar48,auVar73);
              auVar65._0_8_ = -(ulong)(local_280 == (__m128i *)0x0);
              auVar65._8_8_ = -(ulong)(palVar25 == (__m128i *)0x0);
              auVar75._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar75._8_8_ = -(ulong)(palVar26 == (__m128i *)0x0);
              auVar73 = packssdw(auVar65,auVar75);
              auVar48 = packssdw(auVar48,auVar73);
              if (((((b_01 != (__m128i *)0x0 && ptr != (__m128i *)0x0) && b_02 != (__m128i *)0x0) &&
                   b_03 != (__m128i *)0x0) && ptr_00 != (int64_t *)0x0) &&
                  ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar48 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar48 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar48 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar48 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar48 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar48 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar48 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar48 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar48 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar48 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar48[0xf])) {
                iVar20 = s2Len + -1;
                iVar21 = 1 - (int)(uVar37 / size);
                uVar47 = (ulong)(uint)gap;
                local_1b8._0_8_ = uVar45 + 1;
                local_258._0_8_ = 0x7ffffffffffffffe - (long)iVar44;
                auVar49._8_4_ = (int)local_1b8._0_8_;
                auVar49._0_8_ = local_1b8._0_8_;
                auVar49._12_4_ = (int)((ulong)local_1b8._0_8_ >> 0x20);
                auVar83._8_4_ = (int)local_258._0_8_;
                auVar83._0_8_ = local_258._0_8_;
                auVar83._12_4_ = (int)((ulong)local_258._0_8_ >> 0x20);
                alVar104[0] = size;
                len = local_258._0_8_;
                parasail_memset___m128i(b,alVar104,local_258._0_8_);
                c[1] = extraout_RDX_00;
                c[0] = size;
                parasail_memset___m128i(local_280,c,len);
                c_00[1] = extraout_RDX_01;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_02;
                c_01[0] = size;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_03;
                c_02[0] = size;
                parasail_memset___m128i(b_02,c_02,len);
                c_03[1] = extraout_RDX_04;
                c_03[0] = size;
                parasail_memset___m128i(b_03,c_03,len);
                uVar27 = (ulong)(uint)gap;
                lVar29 = (long)iVar42;
                lVar39 = lVar29;
                for (uVar38 = 0; uVar38 != size; uVar38 = uVar38 + 1) {
                  lVar40 = lVar39;
                  for (lVar41 = 0; lVar41 != 2; lVar41 = lVar41 + 1) {
                    *(long *)((long)&h + lVar41 * 8) = lVar40;
                    *(ulong *)((long)&e + lVar41 * 8) = lVar40 - uVar28;
                    lVar40 = lVar40 - size * uVar27;
                  }
                  local_288[uVar38][0] = h.m[0];
                  local_288[uVar38][1] = h.m[1];
                  ptr[uVar38][0] = e.m[0];
                  ptr[uVar38][1] = e.m[1];
                  lVar39 = lVar39 - uVar27;
                }
                *ptr_00 = 0;
                for (uVar34 = 1; s2Len + 1 != uVar34; uVar34 = uVar34 + 1) {
                  ptr_00[uVar34] = lVar29;
                  lVar29 = lVar29 - uVar27;
                }
                uVar27 = (ulong)((int)size - 1);
                uVar34 = 0;
                uStack_c0 = auVar83._8_8_;
                local_258._8_8_ = uStack_c0;
                uStack_b0 = auVar49._8_8_;
                local_1b8._8_8_ = uStack_b0;
                do {
                  ptr_03 = palVar23;
                  ptr_02 = palVar25;
                  palVar23 = palVar24;
                  ptr_01 = palVar26;
                  if (uVar34 == (uint)s2Len) {
                    b_08[0] = size * 4;
                    for (lVar39 = 0; b_08[0] != lVar39; lVar39 = lVar39 + 4) {
                      puVar3 = (undefined4 *)((long)*local_288 + lVar39 * 4);
                      uVar13 = puVar3[2];
                      puVar4 = (undefined4 *)((long)*b + lVar39 * 4);
                      uVar14 = *puVar4;
                      uVar15 = puVar4[2];
                      puVar4 = (undefined4 *)((long)*local_280 + lVar39 * 4);
                      uVar16 = *puVar4;
                      uVar17 = puVar4[2];
                      puVar4 = (undefined4 *)((long)*b_00 + lVar39 * 4);
                      uVar18 = *puVar4;
                      uVar19 = puVar4[2];
                      lVar29 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x20);
                      *(undefined4 *)(lVar29 + lVar39) = *puVar3;
                      *(undefined4 *)(b_08[0] + lVar29 + lVar39) = uVar13;
                      lVar29 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x28);
                      *(undefined4 *)(lVar29 + lVar39) = uVar14;
                      *(undefined4 *)(b_08[0] + lVar29 + lVar39) = uVar15;
                      lVar29 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x30);
                      *(undefined4 *)(lVar29 + lVar39) = uVar16;
                      *(undefined4 *)(b_08[0] + lVar29 + lVar39) = uVar17;
                      lVar29 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x38);
                      *(undefined4 *)(lVar29 + lVar39) = uVar18;
                      *(undefined4 *)(b_08[0] + lVar29 + lVar39) = uVar19;
                    }
                    lVar32 = 0;
                    lVar93 = local_288[uVar10][0];
                    lVar91 = local_288[uVar10][1];
                    lVar87 = b[uVar10][0];
                    lVar71 = b[uVar10][1];
                    lVar63 = local_280[uVar10][0];
                    lVar79 = local_280[uVar10][1];
                    lVar72 = b_00[uVar10][0];
                    lVar84 = b_00[uVar10][1];
                    while (lVar80 = lVar72, lVar72 = lVar63, lVar63 = lVar87, lVar87 = lVar93,
                          (int)lVar32 < iVar21) {
                      lVar93 = 0;
                      lVar91 = lVar87;
                      lVar87 = 0;
                      lVar71 = lVar63;
                      lVar63 = 0;
                      lVar79 = lVar72;
                      lVar72 = 0;
                      lVar84 = lVar80;
                      lVar32 = 1;
                    }
                    local_188 = (undefined4)uVar45;
                    uStack_184 = (undefined4)(uVar45 >> 0x20);
                    local_278._8_4_ = local_188;
                    local_278._0_8_ = uVar45;
                    local_278._12_4_ = uStack_184;
                    a_03[1] = uVar34;
                    a_03[0] = uVar38;
                    b_08[1] = lVar32;
                    _mm_cmpgt_epi64_rpl(a_03,b_08);
                    auVar78._0_8_ = -(ulong)((long)uVar45 < (long)local_258._0_8_);
                    auVar78._8_8_ = -(ulong)((long)local_278._8_8_ < (long)local_258._8_8_);
                    auVar70._8_4_ = 0xffffffff;
                    auVar70._0_8_ = 0xffffffffffffffff;
                    auVar70._12_4_ = 0xffffffff;
                    auVar48 = auVar70 ^ auVar78 | extraout_XMM0_03;
                    if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar48 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar48 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar48 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar48 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar48 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar48 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar48 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar48 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar48 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar48 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar48[0xf]) {
                      iStack_240 = (int)lVar91;
                      iStack_1d0 = (int)lVar71;
                      lStack_1c0._0_4_ = (int)lVar79;
                      iStack_1e0 = (int)lVar84;
                    }
                    else {
                      *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
                      iStack_240 = 0;
                      iStack_1d0 = 0;
                      lStack_1c0._0_4_ = 0;
                      iStack_1e0 = 0;
                      iVar20 = 0;
                      uVar37 = 0;
                    }
                    ppVar22->score = iStack_240;
                    ppVar22->end_query = uVar37;
                    ppVar22->end_ref = iVar20;
                    ((ppVar22->field_4).stats)->matches = iStack_1d0;
                    ((ppVar22->field_4).stats)->similar = (int)lStack_1c0;
                    ((ppVar22->field_4).stats)->length = iStack_1e0;
                    parasail_free(ptr_00);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(ptr);
                    parasail_free(ptr_01);
                    parasail_free(b_00);
                    parasail_free(ptr_02);
                    parasail_free(local_280);
                    parasail_free(palVar23);
                    parasail_free(b);
                    parasail_free(ptr_03);
                    parasail_free(local_288);
                    return ppVar22;
                  }
                  palVar26 = local_288 + uVar27;
                  lVar93 = b[uVar27][0];
                  lVar91 = local_280[uVar27][0];
                  palVar24 = local_288 + uVar27;
                  auVar94._8_4_ = (int)(*palVar24)[0];
                  auVar94._0_8_ = (*palVar24)[0];
                  auVar94._12_4_ = *(undefined4 *)((long)*palVar24 + 4);
                  lVar87 = b_00[uVar27][0];
                  lVar41 = 0;
                  lVar39 = 0;
                  lVar40 = 0;
                  iVar62 = ptr_00[uVar34];
                  lVar29 = auVar94._8_8_;
                  uVar30 = (ulong)(byte)s2[uVar34];
                  lVar46 = (long)(ppVar7->mapper[uVar30] * (int)size) * 0x10;
                  auVar48 = ZEXT816(0);
                  auVar73 = ZEXT816(0);
                  local_278 = auVar49;
                  lVar35 = uVar27 * 0x10;
                  uVar36 = uVar34;
                  auVar98 = _DAT_008a1f70;
                  for (lVar43 = 0; uStack_110 = (ulong)(uint)gap, size << 4 != lVar43;
                      lVar43 = lVar43 + 0x10) {
                    auVar65 = *(undefined1 (*) [16])((long)*ptr + lVar43);
                    auVar75 = *(undefined1 (*) [16])((long)*b_01 + lVar43);
                    auVar83 = *(undefined1 (*) [16])((long)*b_02 + lVar43);
                    plVar1 = (long *)((long)pvVar6 + lVar43 + lVar46);
                    auVar92._0_8_ = iVar62 + *plVar1;
                    auVar92._8_8_ = lVar29 + plVar1[1];
                    auVar95._0_8_ = -(ulong)(auVar65._0_8_ < auVar92._0_8_);
                    auVar95._8_8_ = -(ulong)(auVar65._8_8_ < auVar92._8_8_);
                    auVar94 = blendvpd(auVar65,auVar92,auVar95);
                    auVar81._0_8_ = -(ulong)(local_278._0_8_ < auVar94._0_8_);
                    auVar81._8_8_ = -(ulong)(local_278._8_8_ < auVar94._8_8_);
                    auVar102 = blendvpd(local_278,auVar94,auVar81);
                    auVar94 = *(undefined1 (*) [16])((long)*b_03 + lVar43);
                    *(undefined1 (*) [16])((long)*ptr_03 + lVar43) = auVar102;
                    auVar95 = blendvpd(auVar48,auVar75,auVar81);
                    plVar1 = (long *)((long)pvVar8 + lVar43 + lVar46);
                    auVar96._0_8_ = lVar41 + *plVar1;
                    auVar96._8_8_ = lVar93 + plVar1[1];
                    lVar29 = auVar102._0_8_;
                    auVar74._0_8_ = -(ulong)(auVar92._0_8_ == lVar29);
                    lVar41 = auVar102._8_8_;
                    auVar74._8_8_ = -(ulong)(auVar92._8_8_ == lVar41);
                    auVar96 = blendvpd(auVar95,auVar96,auVar74);
                    *(undefined1 (*) [16])((long)*palVar23 + lVar43) = auVar96;
                    auVar95 = blendvpd(auVar73,auVar83,auVar81);
                    plVar1 = (long *)((long)pvVar9 + lVar43 + lVar46);
                    auVar88._0_8_ = lVar39 + *plVar1;
                    auVar88._8_8_ = lVar91 + plVar1[1];
                    auVar92 = blendvpd(auVar95,auVar88,auVar74);
                    auVar95 = blendvpd(auVar98,auVar94,auVar81);
                    auVar89._8_4_ = 0xffffffff;
                    auVar89._0_8_ = 0xffffffffffffffff;
                    auVar89._12_4_ = 0xffffffff;
                    auVar85._0_8_ = lVar40 + 1;
                    auVar85._8_8_ = lVar87 - auVar89._8_8_;
                    auVar89 = blendvpd(auVar95,auVar85,auVar74);
                    auVar50._0_8_ = -(ulong)(local_258._0_8_ < lVar29);
                    auVar50._8_8_ = -(ulong)(local_258._8_8_ < lVar41);
                    local_258 = blendvpd(auVar102,local_258,auVar50);
                    auVar51._0_8_ = -(ulong)(lVar29 < local_1b8._0_8_);
                    auVar51._8_8_ = -(ulong)(lVar41 < local_1b8._8_8_);
                    auVar95 = blendvpd(auVar102,local_1b8,auVar51);
                    auVar102._0_8_ = -(ulong)(auVar96._0_8_ < auVar95._0_8_);
                    auVar102._8_8_ = -(ulong)(auVar96._8_8_ < auVar95._8_8_);
                    auVar95 = blendvpd(auVar96,auVar95,auVar102);
                    auVar52._0_8_ = -(ulong)(auVar92._0_8_ < auVar95._0_8_);
                    auVar52._8_8_ = -(ulong)(auVar92._8_8_ < auVar95._8_8_);
                    auVar95 = blendvpd(auVar92,auVar95,auVar52);
                    auVar53._0_8_ = -(ulong)(auVar89._0_8_ < auVar95._0_8_);
                    auVar53._8_8_ = -(ulong)(auVar89._8_8_ < auVar95._8_8_);
                    local_1b8 = blendvpd(auVar89,auVar95,auVar53);
                    auVar103._0_8_ = lVar29 - (ulong)(uint)open;
                    auVar103._8_8_ = lVar41 - (ulong)(uint)open;
                    auVar64._0_8_ = auVar65._0_8_ - uVar47;
                    auVar64._8_8_ = auVar65._8_8_ - uStack_110;
                    auVar54._0_8_ = -(ulong)(auVar64._0_8_ < auVar103._0_8_);
                    auVar54._8_8_ = -(ulong)(auVar64._8_8_ < auVar103._8_8_);
                    auVar95 = blendvpd(auVar64,auVar103,auVar54);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar43) = auVar92;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar43) = auVar89;
                    a[1] = uVar36;
                    a[0] = uVar38;
                    b_04[1] = uVar30;
                    b_04[0] = lVar35;
                    alVar104 = _mm_cmpgt_epi64_rpl(a,b_04);
                    b_05[0] = alVar104[1];
                    auVar65 = pblendvb(auVar75,auVar96,extraout_XMM0);
                    auVar75 = pblendvb(auVar83,auVar92,extraout_XMM0);
                    local_78 = auVar94._0_8_;
                    lStack_70 = auVar94._8_8_;
                    auVar86._8_4_ = 0xffffffff;
                    auVar86._0_8_ = 0xffffffffffffffff;
                    auVar86._12_4_ = 0xffffffff;
                    auVar82._0_8_ = local_78 + 1;
                    auVar82._8_8_ = lStack_70 - auVar86._8_8_;
                    auVar90._0_8_ = auVar89._0_8_ + 1;
                    auVar90._8_8_ = auVar89._8_8_ - auVar86._8_8_;
                    auVar83 = pblendvb(auVar82,auVar90,extraout_XMM0);
                    local_98 = auVar95._0_8_;
                    uStack_90 = auVar95._8_8_;
                    puVar2 = (undefined8 *)((long)*ptr + lVar43);
                    *puVar2 = local_98;
                    puVar2[1] = uStack_90;
                    *(undefined1 (*) [16])((long)*b_01 + lVar43) = auVar65;
                    *(undefined1 (*) [16])((long)*b_02 + lVar43) = auVar75;
                    *(undefined1 (*) [16])((long)*b_03 + lVar43) = auVar83;
                    auVar66._0_8_ = local_278._0_8_ - uVar47;
                    auVar66._8_8_ = local_278._8_8_ - uStack_110;
                    auVar55._0_8_ = -(ulong)(auVar66._0_8_ < auVar103._0_8_);
                    auVar55._8_8_ = -(ulong)(auVar66._8_8_ < auVar103._8_8_);
                    local_278 = blendvpd(auVar66,auVar103,auVar55);
                    a_00[1] = uVar36;
                    a_00[0] = uVar38;
                    b_05[1] = uVar30;
                    alVar104 = _mm_cmpgt_epi64_rpl(a_00,b_05);
                    lVar35 = alVar104[1];
                    local_1c8 = auVar98._0_8_;
                    lStack_1c0 = auVar98._8_8_;
                    auVar48 = pblendvb(auVar48,auVar96,extraout_XMM0_00);
                    auVar73 = pblendvb(auVar73,auVar92,extraout_XMM0_00);
                    auVar97._0_8_ = local_1c8 + 1;
                    auVar97._8_8_ = lStack_1c0 + 1;
                    auVar98 = pblendvb(auVar97,auVar90,extraout_XMM0_00);
                    plVar1 = (long *)((long)*local_288 + lVar43);
                    iVar62 = *plVar1;
                    lVar29 = plVar1[1];
                    plVar1 = (long *)((long)*b + lVar43);
                    lVar41 = *plVar1;
                    lVar93 = plVar1[1];
                    plVar1 = (long *)((long)*local_280 + lVar43);
                    lVar39 = *plVar1;
                    lVar91 = plVar1[1];
                    plVar1 = (long *)((long)*b_00 + lVar43);
                    lVar40 = *plVar1;
                    lVar87 = plVar1[1];
                  }
                  for (iVar44 = 0; iVar44 != 2; iVar44 = iVar44 + 1) {
                    auVar67._8_4_ = (int)(*palVar26)[0];
                    auVar67._0_8_ = (*palVar26)[0];
                    auVar67._12_4_ = *(undefined4 *)((long)*palVar26 + 4);
                    auVar101._0_8_ = local_278._0_8_;
                    auVar101._8_4_ = local_278._0_4_;
                    auVar101._12_4_ = local_278._4_4_;
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = auVar48._0_8_;
                    auVar48 = auVar11 << 0x40;
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = auVar73._0_8_;
                    auVar73 = auVar12 << 0x40;
                    iVar62 = ptr_00[uVar34];
                    lVar39 = auVar67._8_8_;
                    local_278._8_8_ = auVar101._8_8_;
                    local_278._0_8_ = ptr_00[uVar34 + 1] - uVar28;
                    auVar99._0_8_ = auVar98._0_8_;
                    auVar99._8_4_ = auVar98._0_4_;
                    auVar99._12_4_ = auVar98._4_4_;
                    auVar98._8_8_ = auVar99._8_8_;
                    auVar98._0_8_ = 1;
                    piVar31 = ptr_00;
                    uVar36 = uVar34;
                    palVar24 = palVar26;
                    for (lVar29 = 0; size << 4 != lVar29; lVar29 = lVar29 + 0x10) {
                      plVar1 = (long *)((long)pvVar6 + lVar29 + lVar46);
                      lVar40 = *plVar1;
                      lVar41 = plVar1[1];
                      auVar65 = *(undefined1 (*) [16])((long)*ptr_03 + lVar29);
                      auVar56._0_8_ = -(ulong)(local_278._0_8_ < auVar65._0_8_);
                      auVar56._8_8_ = -(ulong)(local_278._8_8_ < auVar65._8_8_);
                      auVar65 = blendvpd(local_278,auVar65,auVar56);
                      *(undefined1 (*) [16])((long)*ptr_03 + lVar29) = auVar65;
                      lVar35 = auVar65._0_8_;
                      auVar68._0_8_ = -(ulong)(iVar62 + lVar40 == lVar35);
                      lVar40 = auVar65._8_8_;
                      auVar68._8_8_ = -(ulong)(lVar39 + lVar41 == lVar40);
                      auVar68 = auVar68 | auVar56;
                      auVar75 = blendvpd(auVar48,*(undefined1 (*) [16])((long)*palVar23 + lVar29),
                                         auVar68);
                      *(undefined1 (*) [16])((long)*palVar23 + lVar29) = auVar75;
                      auVar94 = blendvpd(auVar73,*(undefined1 (*) [16])((long)*ptr_02 + lVar29),
                                         auVar68);
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar29) = auVar94;
                      auVar83 = blendvpd(auVar98,*(undefined1 (*) [16])((long)*ptr_01 + lVar29),
                                         auVar68);
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar29) = auVar83;
                      auVar57._0_8_ = -(ulong)(local_258._0_8_ < lVar35);
                      auVar57._8_8_ = -(ulong)(local_258._8_8_ < lVar40);
                      local_258 = blendvpd(auVar65,local_258,auVar57);
                      auVar58._0_8_ = -(ulong)(lVar35 < local_1b8._0_8_);
                      auVar58._8_8_ = -(ulong)(lVar40 < local_1b8._8_8_);
                      auVar65 = blendvpd(auVar65,local_1b8,auVar58);
                      auVar59._0_8_ = -(ulong)(auVar75._0_8_ < auVar65._0_8_);
                      auVar59._8_8_ = -(ulong)(auVar75._8_8_ < auVar65._8_8_);
                      auVar65 = blendvpd(auVar75,auVar65,auVar59);
                      auVar60._0_8_ = -(ulong)(auVar94._0_8_ < auVar65._0_8_);
                      auVar60._8_8_ = -(ulong)(auVar94._8_8_ < auVar65._8_8_);
                      auVar65 = blendvpd(auVar94,auVar65,auVar60);
                      auVar61._0_8_ = -(ulong)(auVar83._0_8_ < auVar65._0_8_);
                      auVar61._8_8_ = -(ulong)(auVar83._8_8_ < auVar65._8_8_);
                      local_1b8 = blendvpd(auVar83,auVar65,auVar61);
                      lVar39 = local_278._0_8_ - uVar47;
                      local_278._8_8_ = local_278._8_8_ - uStack_110;
                      local_278._0_8_ = lVar39;
                      a_01[1] = (longlong)palVar24;
                      a_01[0] = uVar38;
                      b_06[1] = (longlong)piVar31;
                      b_06[0] = uVar36;
                      alVar104 = _mm_cmpgt_epi64_rpl(a_01,b_06);
                      b_07[0] = alVar104[1];
                      auVar76._0_8_ = -(ulong)(lVar39 == lVar35 - (ulong)(uint)open);
                      auVar76._8_8_ = -(ulong)(local_278._8_8_ == lVar40 - (ulong)(uint)open);
                      auVar76 = auVar76 | extraout_XMM0_01;
                      if ((((((((((((((((auVar76 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar76 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar76 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar76 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar76 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar76 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar76 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar76 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar76 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar76 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar76 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar76 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar76 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar76 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar76[0xf]) goto LAB_006dbc2d;
                      a_02[1] = (longlong)palVar24;
                      a_02[0] = uVar38;
                      b_07[1] = (longlong)piVar31;
                      alVar104 = _mm_cmpgt_epi64_rpl(a_02,b_07);
                      uVar36 = alVar104[1];
                      auVar48 = pblendvb(auVar48,auVar75,extraout_XMM0_02);
                      auVar73 = pblendvb(auVar73,auVar94,extraout_XMM0_02);
                      auVar69._8_4_ = 0xffffffff;
                      auVar69._0_8_ = 0xffffffffffffffff;
                      auVar69._12_4_ = 0xffffffff;
                      local_1c8 = auVar98._0_8_;
                      lStack_1c0 = auVar98._8_8_;
                      auVar100._0_8_ = local_1c8 + 1;
                      auVar100._8_8_ = lStack_1c0 - auVar69._8_8_;
                      auVar77._0_8_ = auVar83._0_8_ + 1;
                      auVar77._8_8_ = auVar83._8_8_ - auVar69._8_8_;
                      auVar98 = pblendvb(auVar100,auVar77,extraout_XMM0_02);
                      plVar1 = (long *)((long)*local_288 + lVar29);
                      iVar62 = *plVar1;
                      lVar39 = plVar1[1];
                    }
                  }
LAB_006dbc2d:
                  iVar44 = 0;
                  lVar93 = ptr_01[uVar10][0];
                  lVar91 = ptr_01[uVar10][1];
                  lVar87 = ptr_02[uVar10][0];
                  lVar71 = ptr_02[uVar10][1];
                  lVar63 = palVar23[uVar10][0];
                  lVar79 = palVar23[uVar10][1];
                  lVar72 = ptr_03[uVar10][0];
                  lVar84 = ptr_03[uVar10][1];
                  while (lVar32 = lVar72, lVar72 = lVar63, lVar63 = lVar87, lVar87 = lVar93,
                        iVar44 < iVar21) {
                    lVar93 = 0;
                    lVar91 = lVar87;
                    lVar87 = 0;
                    lVar71 = lVar63;
                    lVar63 = 0;
                    lVar79 = lVar72;
                    lVar72 = 0;
                    lVar84 = lVar32;
                    iVar44 = 1;
                  }
                  *(int *)(*((ppVar22->field_4).trace)->trace_del_table + uVar34 * 4) = (int)lVar84;
                  *(int *)(*(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 8) +
                          uVar34 * 4) = (int)lVar79;
                  *(int *)(*(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x10) +
                          uVar34 * 4) = (int)lVar71;
                  *(int *)(*(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x18) +
                          uVar34 * 4) = (int)lVar91;
                  uVar34 = uVar34 + 1;
                  palVar26 = b_00;
                  palVar24 = b;
                  palVar25 = local_280;
                  b = palVar23;
                  palVar23 = local_288;
                  b_00 = ptr_01;
                  local_288 = ptr_03;
                  local_280 = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar33 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_rowcol_striped_profile_sse41_128_64",pcVar33);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 8);
                vHM = _mm_slli_si128 (vHM, 8);
                vHS = _mm_slli_si128 (vHS, 8);
                vHL = _mm_slli_si128 (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
            vHM = _mm_slli_si128 (vHM, 8);
            vHS = _mm_slli_si128 (vHS, 8);
            vHL = _mm_slli_si128 (vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}